

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr xmlNewInputFromFile(xmlParserCtxtPtr ctxt,char *filename)

{
  int code_00;
  uint local_2c;
  int code;
  int flags;
  xmlParserInputPtr input;
  char *filename_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_2c = 0;
  if ((ctxt == (xmlParserCtxtPtr)0x0) || (filename == (char *)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    if ((ctxt->options & 0x1000000U) != 0) {
      local_2c = 8;
    }
    if ((ctxt->options & 0x800U) == 0) {
      local_2c = local_2c | 0x10;
    }
    input = (xmlParserInputPtr)filename;
    filename_local = (char *)ctxt;
    code_00 = xmlNewInputFromUrl(filename,local_2c,(xmlParserInputPtr *)&code);
    if (code_00 == 0) {
      ctxt_local = _code;
    }
    else {
      xmlCtxtErrIO((xmlParserCtxtPtr)filename_local,code_00,(char *)input);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
  }
  return (xmlParserInputPtr)ctxt_local;
}

Assistant:

xmlParserInputPtr
xmlNewInputFromFile(xmlParserCtxtPtr ctxt, const char *filename) {
    xmlParserInputPtr input;
    int flags = 0;
    int code;

    if ((ctxt == NULL) || (filename == NULL))
        return(NULL);

    if (ctxt->options & XML_PARSE_UNZIP)
        flags |= XML_INPUT_UNZIP;
    if ((ctxt->options & XML_PARSE_NONET) == 0)
        flags |= XML_INPUT_NETWORK;

    code = xmlNewInputFromUrl(filename, flags, &input);
    if (code != XML_ERR_OK) {
        xmlCtxtErrIO(ctxt, code, filename);
        return(NULL);
    }

    return(input);
}